

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementScopedC
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot regSlot,
          PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  RegSlot reg;
  int iVar3;
  int iVar4;
  JITTimeFunctionBody *this_00;
  SymOpnd *dstOpnd;
  SymOpnd *src1Opnd;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SymOpnd *dstOpnd_00;
  Instr *instr;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd_00;
  undefined4 *puVar5;
  Func *func;
  undefined6 in_register_00000032;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId = JITTimeFunctionBody::GetReferencedPropertyId(this_00,propertyIdIndex);
  reg = GetEnvRegForEvalCode(this);
  iVar3 = (int)CONCAT62(in_register_00000032,newOpcode);
  dstOpnd = BuildFieldOpnd(this,newOpcode,reg,propertyId,propertyIdIndex,PropertyKindData,0xffffffff
                          );
  if (iVar3 - 0x8aU < 2) {
    iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x20])();
    iVar4 = (*this->m_func->topFunc->m_scriptContextInfo->_vptr_ScriptContextInfo[0x20])();
    if (CONCAT44(extraout_var,iVar3) != CONCAT44(extraout_var_00,iVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xcd1,
                         "(this->m_func->GetScriptContextInfo()->GetAddr() == this->m_func->GetTopFunc()->GetScriptContextInfo()->GetAddr())"
                         ,
                         "this->m_func->GetScriptContextInfo()->GetAddr() == this->m_func->GetTopFunc()->GetScriptContextInfo()->GetAddr()"
                        );
      if (!bVar2) goto LAB_004948f9;
      *puVar5 = 0;
    }
    dstOpnd_00 = (SymOpnd *)BuildDstOpnd(this,regSlot,TyVar,false,false);
    func = this->m_func;
    src1Opnd = dstOpnd;
  }
  else {
    if (iVar3 == 0x87) {
      src2Opnd = BuildSrcOpnd(this,1,TyVar);
      src1Opnd_00 = BuildSrcOpnd(this,regSlot,TyVar);
      instr = IR::Instr::New(ScopedInitFunc,&dstOpnd->super_Opnd,&src1Opnd_00->super_Opnd,
                             &src2Opnd->super_Opnd,this->m_func);
      goto LAB_00494886;
    }
    if (iVar3 != 0x4d) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xce1,"((0))","Unknown ElementScopedC opcode");
      if (bVar2) {
        *puVar5 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_004948f9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    src1Opnd = (SymOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
    func = this->m_func;
    newOpcode = ScopedEnsureNoRedeclFld;
    dstOpnd_00 = dstOpnd;
  }
  instr = IR::Instr::New(newOpcode,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,func);
LAB_00494886:
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementScopedC(Js::OpCode newOpcode, uint32 offset, Js::RegSlot regSlot, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr;
    Js::PropertyId  propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
    PropertyKind    propertyKind = PropertyKindData;
    IR::RegOpnd * regOpnd;
    Js::RegSlot     fieldRegSlot = this->GetEnvRegForEvalCode();
    IR::SymOpnd *   fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, propertyId, propertyIdIndex, propertyKind);

    switch (newOpcode)
    {
    case Js::OpCode::ScopedEnsureNoRedeclFld:
    {
        regOpnd = this->BuildSrcOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
        break;
    }

    case Js::OpCode::ScopedDeleteFld:
    case Js::OpCode::ScopedDeleteFldStrict:
    {
        Assert(this->m_func->GetScriptContextInfo()->GetAddr() == this->m_func->GetTopFunc()->GetScriptContextInfo()->GetAddr());
        regOpnd = this->BuildDstOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        break;
    }

    case Js::OpCode::ScopedInitFunc:
    {
        // Implicit root object as default instance
        IR::Opnd * instance2Opnd = this->BuildSrcOpnd(Js::FunctionBody::RootObjectRegSlot);
        regOpnd = this->BuildSrcOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, instance2Opnd, m_func);
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementScopedC opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);
}